

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

bool __thiscall
wabt::anon_unknown_7::Validator::CheckHasMemory(Validator *this,Location *loc,Opcode opcode)

{
  size_type sVar1;
  char *pcVar2;
  Location *loc_local;
  Validator *this_local;
  Opcode opcode_local;
  
  this_local._0_4_ = opcode.enum_;
  sVar1 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size
                    (&this->current_module_->memories);
  if (sVar1 == 0) {
    pcVar2 = Opcode::GetName((Opcode *)&this_local);
    PrintError(this,loc,"%s requires an imported or defined memory.",pcVar2);
  }
  return sVar1 != 0;
}

Assistant:

bool Validator::CheckHasMemory(const Location* loc, Opcode opcode) {
  if (current_module_->memories.size() == 0) {
    PrintError(loc, "%s requires an imported or defined memory.",
               opcode.GetName());
    return false;
  }

  return true;
}